

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.cpp
# Opt level: O3

void __thiscall CNscPStackEntry::~CNscPStackEntry(CNscPStackEntry *this)

{
  anon_union_8_2_ecfd7102_for_NscSymbolFence_9 aVar1;
  uchar *puVar2;
  char *pcVar3;
  CNscPStackEntry *pCVar4;
  CNwnDoubleLinkList *pCVar5;
  NscSymbolFence *pNVar6;
  
  pNVar6 = this->m_pFence;
  if (pNVar6 != (NscSymbolFence *)0x0) {
    if (pNVar6->nFenceType == NscFenceType_Switch) {
      aVar1 = pNVar6->field_9;
      if ((aVar1 != (anon_union_8_2_ecfd7102_for_NscSymbolFence_9)0x0) &&
         (*(void **)aVar1 != (void *)0x0)) {
        operator_delete(*(void **)aVar1);
      }
      operator_delete((void *)aVar1);
      pNVar6 = this->m_pFence;
    }
    operator_delete(pNVar6);
  }
  puVar2 = this->m_pauchData;
  if (puVar2 != (uchar *)0x0 && puVar2 != this->m_auchDataFast) {
    operator_delete__(puVar2);
  }
  pcVar3 = this->m_pszId;
  if (pcVar3 != (char *)0x0 && pcVar3 != this->m_achIdFast) {
    operator_delete__(pcVar3);
  }
  pCVar4 = (CNscPStackEntry *)(this->m_link).m_pNext;
  if (pCVar4 != this) {
    pCVar5 = (this->m_link).m_pPrev;
    (pCVar4->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar4;
    (this->m_link).m_pNext = &this->m_link;
    (this->m_link).m_pPrev = &this->m_link;
  }
  return;
}

Assistant:

CNscPStackEntry::~CNscPStackEntry ()
{

	//
	// Delete any of our allocated variables
	//

	if (m_pFence)
	{
		if (m_pFence ->nFenceType == NscFenceType_Switch)
			delete m_pFence ->pSwitchCasesUsed;
		delete m_pFence;
	}
	if (m_pauchData != m_auchDataFast)
		delete [] m_pauchData;
	if (m_pszId != m_achIdFast)
		delete [] m_pszId;
}